

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

GLuint deqp::gls::LifetimeTests::details::getAttachment(Attacher *attacher,GLuint container)

{
  ostringstream *this;
  GLuint GVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  MessageBuilder local_1a0;
  
  GVar1 = (*attacher->_vptr_Attacher[3])(attacher,CONCAT44(in_register_00000034,container));
  local_1a0.m_log = ((attacher->super_ContextWrapper).m_ctx.m_testCtx)->m_log;
  this = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,"// Result of query for ");
  iVar2 = (*attacher->m_elementType->_vptr_Type[7])();
  std::operator<<((ostream *)this,(char *)CONCAT44(extraout_var,iVar2));
  std::operator<<((ostream *)this," attached to ");
  iVar2 = (*attacher->m_containerType->_vptr_Type[7])();
  std::operator<<((ostream *)this,(char *)CONCAT44(extraout_var_00,iVar2));
  std::operator<<((ostream *)this," ");
  std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::operator<<((ostream *)this,": ");
  std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::operator<<((ostream *)this,".");
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return GVar1;
}

Assistant:

GLuint getAttachment (Attacher& attacher, GLuint container)
{
	const GLuint queriedAttachment = attacher.getAttachment(container);
	attacher.log() << TestLog::Message
				   << "// Result of query for " << attacher.getElementType().getName()
				   << " attached to " << attacher.getContainerType().getName() << " "
				   << container << ": " << queriedAttachment << "."
				   << TestLog::EndMessage;
	return queriedAttachment;
}